

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O1

void kratos::hash_generator_name(Context *context,Generator *generator)

{
  size_type sVar1;
  ulong hash;
  size_type sVar2;
  
  hash = 0xcbf29ce484222325;
  sVar1 = (generator->name)._M_string_length;
  if (sVar1 != 0) {
    sVar2 = 0;
    do {
      hash = ((byte)(generator->name)._M_dataplus._M_p[sVar2] ^ hash) * 0x100000001b3;
      sVar2 = sVar2 + 1;
    } while (sVar1 != sVar2);
    Context::add_hash(context,generator,hash);
    return;
  }
  Context::add_hash(context,generator,0xcbf29ce484222325);
  return;
}

Assistant:

void hash_generator_name(Context* context, Generator* generator) {
    auto const& name = generator->name;
    uint64_t hash = hash_64_fnv1a(name.c_str(), name.size());
    context->add_hash(generator, hash);
}